

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvHin(CVodeMem cv_mem,realtype tout)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  CVodeMem cv_mem_00;
  double dVar5;
  realtype rVar6;
  int hgOK;
  realtype yddnrm;
  realtype h0;
  realtype hrat;
  realtype hnew;
  realtype hs;
  realtype hgs;
  realtype hg;
  realtype hub;
  realtype hlb;
  realtype tround;
  realtype tdist;
  realtype tdiff;
  int count2;
  int count1;
  int sign;
  int retval;
  realtype *in_stack_ffffffffffffff38;
  CVodeMem in_stack_ffffffffffffff40;
  CVodeMem in_stack_ffffffffffffff48;
  CVodeMem local_b0;
  realtype in_stack_ffffffffffffff58;
  double local_88;
  double local_80;
  CVodeMem local_70;
  CVodeMem local_68;
  CVodeMem local_58;
  int local_28;
  int local_24;
  int local_4;
  
  dVar4 = in_XMM0_Qa - *(double *)(in_RDI + 0x168);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    iVar2 = -1;
    if (0.0 < dVar4) {
      iVar2 = 1;
    }
    if (ABS(*(double *)(in_RDI + 0x168)) <= ABS(in_XMM0_Qa)) {
      cv_mem_00 = (CVodeMem)((ulong)in_XMM0_Qa & 0x7fffffffffffffff);
    }
    else {
      cv_mem_00 = (CVodeMem)(*(ulong *)(in_RDI + 0x168) & 0x7fffffffffffffff);
    }
    dVar5 = *(double *)(in_RDI + 8) * (double)cv_mem_00;
    if (dVar5 * 2.0 <= ABS(dVar4)) {
      dVar5 = dVar5 * 100.0;
      rVar6 = cvUpperBoundH0(cv_mem_00,in_stack_ffffffffffffff58);
      if (0.0 < dVar5 * rVar6) {
        local_68 = (CVodeMem)sqrt(dVar5 * rVar6);
      }
      else {
        local_68 = (CVodeMem)0x0;
      }
      if (dVar5 <= rVar6) {
        local_58 = local_68;
        for (local_24 = 1; local_24 < 5; local_24 = local_24 + 1) {
          bVar1 = false;
          for (local_28 = 1; local_28 < 5; local_28 = local_28 + 1) {
            iVar3 = cvYddNorm(in_stack_ffffffffffffff48,(realtype)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff38);
            if (iVar3 < 0) {
              return -8;
            }
            if (iVar3 == 0) {
              bVar1 = true;
              break;
            }
            local_58 = (CVodeMem)((double)local_58 * 0.2);
          }
          if (!bVar1) {
            if (local_24 < 3) {
              return -10;
            }
            local_70 = local_68;
            break;
          }
          local_68 = local_58;
          if (local_88 * rVar6 * rVar6 <= 2.0) {
            if (0.0 < (double)local_58 * rVar6) {
              in_stack_ffffffffffffff40 = (CVodeMem)sqrt((double)local_58 * rVar6);
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff40;
            }
            else {
              in_stack_ffffffffffffff40 = (CVodeMem)0x0;
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff40;
            }
          }
          else if (0.0 < 2.0 / local_88) {
            in_stack_ffffffffffffff48 = (CVodeMem)sqrt(2.0 / local_88);
          }
          else {
            local_b0 = (CVodeMem)0x0;
            in_stack_ffffffffffffff48 = local_b0;
          }
          local_70 = in_stack_ffffffffffffff48;
          if ((local_24 == 4) ||
             ((dVar4 = (double)in_stack_ffffffffffffff48 / (double)local_58, 0.5 < dVar4 &&
              (dVar4 < 2.0)))) break;
          if ((1 < local_24) && (2.0 < dVar4)) {
            local_70 = local_58;
            break;
          }
          local_58 = in_stack_ffffffffffffff48;
        }
        local_80 = (double)local_70 * 0.5;
        if ((double)local_70 * 0.5 < dVar5) {
          local_80 = dVar5;
        }
        if (rVar6 < local_80) {
          local_80 = rVar6;
        }
        if (iVar2 == -1) {
          local_80 = -local_80;
        }
        *(double *)(in_RDI + 0x140) = local_80;
        local_4 = 0;
      }
      else {
        if (iVar2 == -1) {
          *(double *)(in_RDI + 0x140) = -(double)local_68;
        }
        else {
          *(CVodeMem *)(in_RDI + 0x140) = local_68;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x1b;
    }
  }
  else {
    local_4 = -0x1b;
  }
  return local_4;
}

Assistant:

static int cvHin(CVodeMem cv_mem, realtype tout)
{
  int retval, sign, count1, count2;
  realtype tdiff, tdist, tround, hlb, hub;
  realtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  booleantype hgOK;

  /* If tout is too close to tn, give up */

  if ((tdiff = tout-cv_mem->cv_tn) == ZERO) return(CV_TOO_CLOSE);

  sign = (tdiff > ZERO) ? 1 : -1;
  tdist = SUNRabs(tdiff);
  tround = cv_mem->cv_uround * SUNMAX(SUNRabs(cv_mem->cv_tn), SUNRabs(tout));

  if (tdist < TWO*tround) return(CV_TOO_CLOSE);

  /*
     Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other.
  */

  hlb = HLB_FACTOR * tround;
  hub = cvUpperBoundH0(cv_mem, tdist);

  hg  = SUNRsqrt(hlb*hub);

  if (hub < hlb) {
    if (sign == -1) cv_mem->cv_h = -hg;
    else            cv_mem->cv_h =  hg;
    return(CV_SUCCESS);
  }

  /* Outer loop */

  hs = hg;         /* safeguard against 'uninitialized variable' warning */

  for(count1 = 1; count1 <= MAX_ITERS; count1++) {

    /* Attempts to estimate ydd */

    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= MAX_ITERS; count2++) {
      hgs = hg*sign;
      retval = cvYddNorm(cv_mem, hgs, &yddnrm);
      /* If the RHS function failed unrecoverably, give up */
      if (retval < 0) return(CV_RHSFUNC_FAIL);
      /* If successful, we can use ydd */
      if (retval == CV_SUCCESS) {hgOK = SUNTRUE; break;}
      /* The RHS function failed recoverably; cut step size and test again */
      hg *= POINT2;
    }

    /* If the RHS function failed recoverably MAX_ITERS times */

    if (!hgOK) {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) return(CV_REPTD_RHSFUNC_ERR);
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm*hub*hub > TWO) ? SUNRsqrt(TWO/yddnrm) : SUNRsqrt(hg*hub);

    /* If last pass, stop now with hnew */
    if (count1 == MAX_ITERS) break;

    hrat = hnew/hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) break;

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO)) {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;

  }

  /* Apply bounds, bias factor, and attach sign */

  h0 = H_BIAS*hnew;
  if (h0 < hlb) h0 = hlb;
  if (h0 > hub) h0 = hub;
  if (sign == -1) h0 = -h0;
  cv_mem->cv_h = h0;

  return(CV_SUCCESS);
}